

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

bool cmState::ParseCacheEntry(string *entry,string *var,string *value,CacheEntryType *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  char *pcVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  CacheEntryType type_1;
  string local_58;
  CacheEntryType local_34;
  
  if ((ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
       ::reg == '\0') &&
     (iVar6 = __cxa_guard_acquire(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                                   ::reg), iVar6 != 0)) {
    ParseCacheEntry::reg.regmust = (char *)0x0;
    ParseCacheEntry::reg.program = (char *)0x0;
    ParseCacheEntry::reg.progsize = 0;
    memset(&ParseCacheEntry::reg,0,0xaa);
    cmsys::RegularExpression::compile
              (&ParseCacheEntry::reg,"^([^=:]*):([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseCacheEntry::reg,&__dso_handle);
    __cxa_guard_release(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                         ::reg);
  }
  if ((ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
       ::regQuoted == '\0') &&
     (iVar6 = __cxa_guard_acquire(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                                   ::regQuoted), iVar6 != 0)) {
    ParseCacheEntry::regQuoted.regmust = (char *)0x0;
    ParseCacheEntry::regQuoted.program = (char *)0x0;
    ParseCacheEntry::regQuoted.progsize = 0;
    memset(&ParseCacheEntry::regQuoted,0,0xaa);
    cmsys::RegularExpression::compile
              (&ParseCacheEntry::regQuoted,"^\"([^\"]*)\":([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseCacheEntry::regQuoted,
                 &__dso_handle);
    __cxa_guard_release(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                         ::regQuoted);
  }
  bVar5 = cmsys::RegularExpression::find
                    (&ParseCacheEntry::regQuoted,(entry->_M_dataplus)._M_p,
                     &ParseCacheEntry::regQuoted.regmatch);
  if (bVar5) {
    if (ParseCacheEntry::regQuoted.regmatch.startp[1] == (char *)0x0) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,ParseCacheEntry::regQuoted.regmatch.startp[1],
                 ParseCacheEntry::regQuoted.regmatch.endp[1]);
    }
    std::__cxx11::string::operator=((string *)var,(string *)&local_58);
    paVar1 = &local_58.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    local_58._M_dataplus._M_p = (pointer)paVar1;
    if (ParseCacheEntry::regQuoted.regmatch.startp[2] == (char *)0x0) {
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,ParseCacheEntry::regQuoted.regmatch.startp[2],
                 ParseCacheEntry::regQuoted.regmatch.endp[2]);
    }
    _Var4._M_p = local_58._M_dataplus._M_p;
    local_34 = STRING;
    StringToCacheEntryType(&local_58,&local_34);
    *type = local_34;
    pcVar2 = ParseCacheEntry::regQuoted.regmatch.startp[3];
    pcVar3 = ParseCacheEntry::regQuoted.regmatch.endp[3];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p != paVar1) {
      operator_delete(_Var4._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
      pcVar2 = ParseCacheEntry::regQuoted.regmatch.startp[3];
      pcVar3 = ParseCacheEntry::regQuoted.regmatch.endp[3];
    }
joined_r0x0016b438:
    if (pcVar2 == (char *)0x0) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar2,pcVar3);
    }
    std::__cxx11::string::operator=((string *)value,(string *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) goto LAB_0016b483;
  }
  else {
    bVar5 = cmsys::RegularExpression::find
                      (&ParseCacheEntry::reg,(entry->_M_dataplus)._M_p,
                       &ParseCacheEntry::reg.regmatch);
    if (bVar5) {
      if (ParseCacheEntry::reg.regmatch.startp[1] == (char *)0x0) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
      }
      else {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,ParseCacheEntry::reg.regmatch.startp[1],
                   ParseCacheEntry::reg.regmatch.endp[1]);
      }
      std::__cxx11::string::operator=((string *)var,(string *)&local_58);
      paVar1 = &local_58.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      local_58._M_dataplus._M_p = (pointer)paVar1;
      if (ParseCacheEntry::reg.regmatch.startp[2] == (char *)0x0) {
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,ParseCacheEntry::reg.regmatch.startp[2],
                   ParseCacheEntry::reg.regmatch.endp[2]);
      }
      _Var4._M_p = local_58._M_dataplus._M_p;
      local_34 = STRING;
      StringToCacheEntryType(&local_58,&local_34);
      *type = local_34;
      pcVar2 = ParseCacheEntry::reg.regmatch.startp[3];
      pcVar3 = ParseCacheEntry::reg.regmatch.endp[3];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var4._M_p != paVar1) {
        operator_delete(_Var4._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
        pcVar2 = ParseCacheEntry::reg.regmatch.startp[3];
        pcVar3 = ParseCacheEntry::reg.regmatch.endp[3];
      }
      goto joined_r0x0016b438;
    }
    if ((ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
         ::reg == '\0') &&
       (iVar6 = __cxa_guard_acquire(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                                     ::reg), iVar6 != 0)) {
      ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
      ::reg._176_8_ = 0;
      ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
      ::reg._192_8_ = 0;
      ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
      ::reg._200_4_ = 0;
      memset(ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
             ::reg,0,0xaa);
      cmsys::RegularExpression::compile
                ((RegularExpression *)
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::reg,"^([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::reg,&__dso_handle);
      __cxa_guard_release(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                           ::reg);
    }
    if ((ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
         ::regQuoted == '\0') &&
       (iVar6 = __cxa_guard_acquire(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                                     ::regQuoted), iVar6 != 0)) {
      ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
      ::regQuoted._176_8_ = 0;
      ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
      ::regQuoted._192_8_ = 0;
      ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
      ::regQuoted._200_4_ = 0;
      memset(ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
             ::regQuoted,0,0xaa);
      cmsys::RegularExpression::compile
                ((RegularExpression *)
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::regQuoted,"^\"([^\"]*)\"=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::regQuoted,&__dso_handle);
      __cxa_guard_release(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                           ::regQuoted);
    }
    bVar5 = cmsys::RegularExpression::find
                      ((RegularExpression *)
                       ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                       ::regQuoted,(entry->_M_dataplus)._M_p,
                       (RegularExpressionMatch *)
                       ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                       ::regQuoted);
    if (bVar5) {
      if (ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
          ::regQuoted._8_8_ == 0) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
      }
      else {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::regQuoted._8_8_,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::regQuoted._88_8_);
      }
      std::__cxx11::string::operator=((string *)var,(string *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      uVar7 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::regQuoted._96_8_;
      uVar8 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::regQuoted._16_8_;
      if (ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
          ::regQuoted._16_8_ != 0) goto LAB_0016b590;
LAB_0016b59d:
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
    }
    else {
      bVar5 = cmsys::RegularExpression::find
                        ((RegularExpression *)
                         ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                         ::reg,(entry->_M_dataplus)._M_p,
                         (RegularExpressionMatch *)
                         ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                         ::reg);
      if (!bVar5) {
        return false;
      }
      if (ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
          ::reg._8_8_ == 0) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
      }
      else {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::reg._8_8_,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::reg._88_8_);
      }
      std::__cxx11::string::operator=((string *)var,(string *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      uVar7 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::reg._96_8_;
      uVar8 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::reg._16_8_;
      if (ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
          ::reg._16_8_ == 0) goto LAB_0016b59d;
LAB_0016b590:
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,uVar8,uVar7);
    }
    std::__cxx11::string::operator=((string *)value,(string *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) goto LAB_0016b483;
  }
  operator_delete(local_58._M_dataplus._M_p,
                  CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                           local_58.field_2._M_local_buf[0]) + 1);
LAB_0016b483:
  if (((1 < value->_M_string_length) && (pcVar2 = (value->_M_dataplus)._M_p, *pcVar2 == '\'')) &&
     (pcVar2[value->_M_string_length - 1] == '\'')) {
    std::__cxx11::string::substr((ulong)&local_58,(ulong)value);
    std::__cxx11::string::operator=((string *)value,(string *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  return true;
}

Assistant:

bool cmState::ParseCacheEntry(const std::string& entry, std::string& var,
                              std::string& value,
                              cmStateEnums::CacheEntryType& type)
{
  // input line is:         key:type=value
  static cmsys::RegularExpression reg(
    "^([^=:]*):([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
  // input line is:         "key":type=value
  static cmsys::RegularExpression regQuoted(
    "^\"([^\"]*)\":([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
  bool flag = false;
  if (regQuoted.find(entry)) {
    var = regQuoted.match(1);
    type = cmState::StringToCacheEntryType(regQuoted.match(2));
    value = regQuoted.match(3);
    flag = true;
  } else if (reg.find(entry)) {
    var = reg.match(1);
    type = cmState::StringToCacheEntryType(reg.match(2));
    value = reg.match(3);
    flag = true;
  }

  // if value is enclosed in single quotes ('foo') then remove them
  // it is used to enclose trailing space or tab
  if (flag && value.size() >= 2 && value.front() == '\'' &&
      value.back() == '\'') {
    value = value.substr(1, value.size() - 2);
  }

  if (!flag) {
    return ParseEntryWithoutType(entry, var, value);
  }

  return flag;
}